

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O0

deUint32 glu::chooseDepthStencilFormat(RenderConfig *config)

{
  int iVar1;
  int iVar2;
  int stencilBits;
  int depthBits;
  TextureFormat combinedFormat;
  deUint32 format;
  int fmtNdx;
  RenderConfig *config_local;
  
  combinedFormat.type = SNORM_INT8;
  while( true ) {
    if (5 < (int)combinedFormat.type) {
      return 0;
    }
    combinedFormat.order = chooseDepthStencilFormat::s_formats[(int)combinedFormat.type];
    _stencilBits = mapGLInternalFormat(combinedFormat.order);
    iVar1 = getNumDepthBits((TextureFormat *)&stencilBits);
    iVar2 = getNumStencilBits((TextureFormat *)&stencilBits);
    if (((config->depthBits == -1) || (config->depthBits == iVar1)) &&
       ((config->stencilBits == -1 || (config->stencilBits == iVar2)))) break;
    combinedFormat.type = combinedFormat.type + SNORM_INT16;
  }
  return combinedFormat.order;
}

Assistant:

deUint32 chooseDepthStencilFormat (const glu::RenderConfig& config)
{
	static const deUint32 s_formats[] =
	{
		GL_DEPTH32F_STENCIL8,
		GL_DEPTH24_STENCIL8,
		GL_DEPTH_COMPONENT32F,
		GL_DEPTH_COMPONENT24,
		GL_DEPTH_COMPONENT16,
		GL_STENCIL_INDEX8
	};

	for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(s_formats); fmtNdx++)
	{
		const deUint32				format			= s_formats[fmtNdx];
		const tcu::TextureFormat	combinedFormat	= glu::mapGLInternalFormat(format);
		const int					depthBits		= getNumDepthBits(combinedFormat);
		const int					stencilBits		= getNumStencilBits(combinedFormat);

		if (config.depthBits != glu::RenderConfig::DONT_CARE &&
			config.depthBits != depthBits)
			continue;

		if (config.stencilBits != glu::RenderConfig::DONT_CARE &&
			config.stencilBits != stencilBits)
			continue;

		return format;
	}

	return 0;
}